

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField
          (FieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  string_view text;
  string_view text_00;
  JvmNameContext name_ctx;
  anon_class_1_0_00000001 local_3f1;
  long *local_3f0;
  undefined8 local_3e8;
  long local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [24];
  code *local_3b8;
  byte local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_398;
  undefined7 uStack_397;
  undefined1 local_388;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_380;
  long *local_338;
  undefined8 local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  undefined8 uStack_320;
  long *local_318;
  undefined8 local_310;
  undefined1 local_308;
  undefined7 uStack_307;
  undefined8 uStack_300;
  long *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  undefined8 uStack_2e0;
  long *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  undefined8 uStack_2c0;
  long *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  long *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  Options *local_278;
  Printer *local_270;
  undefined1 local_268;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined2 local_218;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined2 local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined2 local_178;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  local_278 = &this->context_->options_;
  local_268 = this->lite_;
  text._M_str = 
  "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
  ;
  text._M_len = 0x113;
  local_270 = printer;
  io::Printer::Print<>(printer,text);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldDocComment(printer,pFVar1,(Options *)local_80,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  text_00._M_str =
       "$kt_deprecation$ public val $kt_name$: com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>\n$  jvm_synthetic$  get() = com.google.protobuf.kotlin.DslList(\n    $kt_dsl_builder$.${$$kt_property_name$List$}$\n  )\n"
  ;
  text_00._M_len = 0xec;
  io::Printer::Print<>(printer,text_00);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_d0[4] = (pCVar2->options_).opensource_runtime;
  local_d0[5] = (pCVar2->options_).annotate_code;
  local_d0[0] = (pCVar2->options_).generate_immutable_code;
  local_d0[1] = (pCVar2->options_).generate_mutable_code;
  local_d0[2] = (pCVar2->options_).generate_shared_code;
  local_d0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldAccessorDocComment(printer,pFVar1,LIST_ADDER,(Options *)local_d0,false,true,false)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  local_298 = (long *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"jvm_name","");
  if (local_298 == (long *)&local_288) {
    uStack_3d8 = uStack_280;
    local_3f0 = &local_3e0;
  }
  else {
    local_3f0 = local_298;
  }
  local_3e0 = CONCAT71(uStack_287,local_288);
  local_3e8 = local_290;
  local_290 = 0;
  local_288 = 0;
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3d0._0_8_ = &local_278;
  local_3d0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_3b0 = 1;
  local_3a0 = 0;
  local_398 = 0;
  local_388 = 0;
  local_3a8 = &local_398;
  local_298 = (long *)&local_288;
  std::__cxx11::string::_M_replace((ulong)&local_3a8,0,(char *)0x0,0x522f0c);
  local_380._M_engaged = false;
  io::Printer::Emit(printer,&local_3f0,1,0xc4);
  if (local_380._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_380);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_3b0]._M_data)
            (&local_3f1,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_3d0);
  local_3b0 = 0xff;
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_298 != (long *)&local_288) {
    operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_120[4] = (pCVar2->options_).opensource_runtime;
  local_120[5] = (pCVar2->options_).annotate_code;
  local_120[0] = (pCVar2->options_).generate_immutable_code;
  local_120[1] = (pCVar2->options_).generate_mutable_code;
  local_120[2] = (pCVar2->options_).generate_shared_code;
  local_120[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_118._M_p = (pointer)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_ADDER,(Options *)local_120,false,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  local_2b8 = (long *)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"jvm_name","");
  if (local_2b8 == (long *)&local_2a8) {
    uStack_3d8 = uStack_2a0;
    local_3f0 = &local_3e0;
  }
  else {
    local_3f0 = local_2b8;
  }
  local_3e0 = CONCAT71(uStack_2a7,local_2a8);
  local_3e8 = local_2b0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3d0._0_8_ = &local_278;
  local_3d0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_3b0 = 1;
  local_3a0 = 0;
  local_398 = 0;
  local_388 = 0;
  local_3a8 = &local_398;
  local_2b8 = (long *)&local_2a8;
  std::__cxx11::string::_M_replace((ulong)&local_3a8,0,(char *)0x0,0x522f0c);
  local_380._M_engaged = false;
  io::Printer::Emit(printer,&local_3f0,1,0xd1);
  if (local_380._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_380);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_3b0]._M_data)
            (&local_3f1,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_3d0);
  local_3b0 = 0xff;
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_2b8 != (long *)&local_2a8) {
    operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_170[4] = (pCVar2->options_).opensource_runtime;
  local_170[5] = (pCVar2->options_).annotate_code;
  local_170[0] = (pCVar2->options_).generate_immutable_code;
  local_170[1] = (pCVar2->options_).generate_mutable_code;
  local_170[2] = (pCVar2->options_).generate_shared_code;
  local_170[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_148._M_p = (pointer)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_128._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_128._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_MULTI_ADDER,(Options *)local_170,false,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  local_2d8 = (long *)&local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"jvm_name","");
  if (local_2d8 == (long *)&local_2c8) {
    uStack_3d8 = uStack_2c0;
    local_3f0 = &local_3e0;
  }
  else {
    local_3f0 = local_2d8;
  }
  local_3e0 = CONCAT71(uStack_2c7,local_2c8);
  local_3e8 = local_2d0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3d0._0_8_ = &local_278;
  local_3d0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_3b0 = 1;
  local_3a0 = 0;
  local_398 = 0;
  local_388 = 0;
  local_3a8 = &local_398;
  local_2d8 = (long *)&local_2c8;
  std::__cxx11::string::_M_replace((ulong)&local_3a8,0,(char *)0x0,0x522f0c);
  local_380._M_engaged = false;
  io::Printer::Emit(printer,&local_3f0,1,0xe9);
  if (local_380._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_380);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_3b0]._M_data)
            (&local_3f1,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_3d0);
  local_3b0 = 0xff;
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_2d8 != (long *)&local_2c8) {
    operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_1c0[4] = (pCVar2->options_).opensource_runtime;
  local_1c0[5] = (pCVar2->options_).annotate_code;
  local_1c0[0] = (pCVar2->options_).generate_immutable_code;
  local_1c0[1] = (pCVar2->options_).generate_mutable_code;
  local_1c0[2] = (pCVar2->options_).generate_shared_code;
  local_1c0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_1b8._M_p = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_198._M_p = (pointer)&local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_178._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_178._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_MULTI_ADDER,(Options *)local_1c0,false,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  local_2f8 = (long *)&local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"jvm_name","");
  if (local_2f8 == (long *)&local_2e8) {
    uStack_3d8 = uStack_2e0;
    local_3f0 = &local_3e0;
  }
  else {
    local_3f0 = local_2f8;
  }
  local_3e0 = CONCAT71(uStack_2e7,local_2e8);
  local_3e8 = local_2f0;
  local_2f0 = 0;
  local_2e8 = 0;
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3d0._0_8_ = &local_278;
  local_3d0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_3b0 = 1;
  local_3a0 = 0;
  local_398 = 0;
  local_388 = 0;
  local_3a8 = &local_398;
  local_2f8 = (long *)&local_2e8;
  std::__cxx11::string::_M_replace((ulong)&local_3a8,0,(char *)0x0,0x522f0c);
  local_380._M_engaged = false;
  io::Printer::Emit(printer,&local_3f0,1,0xf3);
  if (local_380._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_380);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_3b0]._M_data)
            (&local_3f1,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_3d0);
  local_3b0 = 0xff;
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_2f8 != (long *)&local_2e8) {
    operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_210[4] = (pCVar2->options_).opensource_runtime;
  local_210[5] = (pCVar2->options_).annotate_code;
  local_210[0] = (pCVar2->options_).generate_immutable_code;
  local_210[1] = (pCVar2->options_).generate_mutable_code;
  local_210[2] = (pCVar2->options_).generate_shared_code;
  local_210[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_208._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_1e8._M_p = (pointer)&local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_1c8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_1c8._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldAccessorDocComment
            (printer,pFVar1,LIST_INDEXED_SETTER,(Options *)local_210,false,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  local_318 = (long *)&local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"jvm_name","");
  if (local_318 == (long *)&local_308) {
    uStack_3d8 = uStack_300;
    local_3f0 = &local_3e0;
  }
  else {
    local_3f0 = local_318;
  }
  local_3e0 = CONCAT71(uStack_307,local_308);
  local_3e8 = local_310;
  local_310 = 0;
  local_308 = 0;
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3d0._0_8_ = &local_278;
  local_3d0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_3b0 = 1;
  local_3a0 = 0;
  local_398 = 0;
  local_388 = 0;
  local_3a8 = &local_398;
  local_318 = (long *)&local_308;
  std::__cxx11::string::_M_replace((ulong)&local_3a8,0,(char *)0x0,0x522f0c);
  local_380._M_engaged = false;
  io::Printer::Emit(printer,&local_3f0,1,0xe7);
  if (local_380._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_380);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_3b0]._M_data)
            (&local_3f1,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_3d0);
  local_3b0 = 0xff;
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_318 != (long *)&local_308) {
    operator_delete(local_318,CONCAT71(uStack_307,local_308) + 1);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_260[4] = (pCVar2->options_).opensource_runtime;
  local_260[5] = (pCVar2->options_).annotate_code;
  local_260[0] = (pCVar2->options_).generate_immutable_code;
  local_260[1] = (pCVar2->options_).generate_mutable_code;
  local_260[2] = (pCVar2->options_).generate_shared_code;
  local_260[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_258._M_p = (pointer)&local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_238._M_p = (pointer)&local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_218._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_218._1_1_ = (pCVar2->options_).jvm_dsl;
  java::WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,(Options *)local_260,false,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != &local_228) {
    operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
  }
  local_338 = (long *)&local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"jvm_name","");
  if (local_338 == (long *)&local_328) {
    uStack_3d8 = uStack_320;
    local_3f0 = &local_3e0;
  }
  else {
    local_3f0 = local_338;
  }
  local_3e0 = CONCAT71(uStack_327,local_328);
  local_3e8 = local_330;
  local_330 = 0;
  local_328 = 0;
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3d0._0_8_ = &local_278;
  local_3d0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_3b0 = 1;
  local_3a0 = 0;
  local_398 = 0;
  local_388 = 0;
  local_3a8 = &local_398;
  local_338 = (long *)&local_328;
  std::__cxx11::string::_M_replace((ulong)&local_3a8,0,(char *)0x0,0x522f0c);
  local_380._M_engaged = false;
  io::Printer::Emit(printer,&local_3f0,1,0xb3,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.clear() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
                   );
  if (local_380._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_380);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_3b0]._M_data)
            (&local_3f1,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_3d0);
  local_3b0 = 0xff;
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_338 != (long *)&local_328) {
    operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
  }
  return;
}

Assistant:

void FieldGenerator::GenerateRepeatedMessageField(io::Printer* printer) const {
  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  printer->Print(
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Print(
      "$kt_deprecation$ public val $kt_name$: "
      "com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "$  jvm_synthetic$"
      "  get() = com.google.protobuf.kotlin.DslList(\n"
      "    $kt_dsl_builder$.${$$kt_property_name$List$}$\n"
      "  )\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("add$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "add(value: $kt_type$) {\n"
      "  $kt_dsl_builder$.${$add$capitalized_name$$}$(value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("plusAssign$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(value: $kt_type$) {\n"
      "  add(value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("addAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "addAll(values: kotlin.collections.Iterable<$kt_type$>) {\n"
      "  $kt_dsl_builder$.${$addAll$capitalized_name$$}$(values)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("plusAssignAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(values: kotlin.collections.Iterable<$kt_type$>) {\n"
      "  addAll(values)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_INDEXED_SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("set$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "set(index: kotlin.Int, value: $kt_type$) {\n"
      "  $kt_dsl_builder$.${$set$capitalized_name$$}$(index, value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("clear$kt_capitalized_name$", name_ctx); }},
      },

      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "clear() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");
}